

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator_enc.c
# Opt level: O3

void VP8IteratorStartI4(VP8EncIterator *it)

{
  undefined4 uVar1;
  VP8Encoder *pVVar2;
  uint8_t *puVar3;
  long lVar4;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 auVar5 [16];
  
  pVVar2 = it->enc_;
  it->i4_ = 0;
  puVar3 = it->i4_boundary_;
  it->i4_top_ = it->i4_boundary_ + 0x11;
  lVar4 = 0x11;
  do {
    *puVar3 = it->y_left_[lVar4 + -2];
    puVar3 = puVar3 + 1;
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = 0;
  do {
    it->i4_boundary_[lVar4 + 0x11] = it->y_top_[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0x10);
  if (it->x_ < pVVar2->mb_w_ + -1) {
    lVar4 = 0;
    do {
      it->i4_boundary_[lVar4 + 0x21] = it->y_top_[lVar4 + 0x10];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    VP8IteratorNzToBytes(it);
    return;
  }
  uVar1 = *(undefined4 *)(it->i4_boundary_ + 0x20);
  uVar8 = (undefined1)((uint)uVar1 >> 0x18);
  uVar7 = (undefined1)((uint)uVar1 >> 0x10);
  uVar6 = (undefined1)((uint)uVar1 >> 8);
  auVar5._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(uVar8,uVar8),uVar7),CONCAT14(uVar7,uVar1)) >> 0x20
                      );
  auVar5[3] = uVar6;
  auVar5[2] = uVar6;
  auVar5[0] = (undefined1)uVar1;
  auVar5[1] = auVar5[0];
  auVar5._8_8_ = 0;
  auVar5 = pshuflw(auVar5,auVar5,0);
  *(int *)(it->i4_boundary_ + 0x21) = auVar5._0_4_;
  VP8IteratorNzToBytes(it);
  return;
}

Assistant:

void VP8IteratorStartI4(VP8EncIterator* const it) {
  const VP8Encoder* const enc = it->enc_;
  int i;

  it->i4_ = 0;    // first 4x4 sub-block
  it->i4_top_ = it->i4_boundary_ + VP8TopLeftI4[0];

  // Import the boundary samples
  for (i = 0; i < 17; ++i) {    // left
    it->i4_boundary_[i] = it->y_left_[15 - i];
  }
  for (i = 0; i < 16; ++i) {    // top
    it->i4_boundary_[17 + i] = it->y_top_[i];
  }
  // top-right samples have a special case on the far right of the picture
  if (it->x_ < enc->mb_w_ - 1) {
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary_[17 + i] = it->y_top_[i];
    }
  } else {    // else, replicate the last valid pixel four times
    for (i = 16; i < 16 + 4; ++i) {
      it->i4_boundary_[17 + i] = it->i4_boundary_[17 + 15];
    }
  }
#if WEBP_AARCH64 && BPS == 32 && defined(WEBP_MSAN)
  // Intra4Preds_NEON() reads 3 uninitialized bytes from i4_boundary_ when top
  // is positioned at offset 29 (VP8TopLeftI4[3]). The values are not used
  // meaningfully, but due to limitations in MemorySanitizer related to
  // modeling of tbl instructions, a warning will be issued. This can be
  // removed if MSan is updated to support the instructions. See
  // https://issues.webmproject.org/372109644.
  memset(it->i4_boundary_ + sizeof(it->i4_boundary_) - 3, 0xaa, 3);
#endif
  VP8IteratorNzToBytes(it);  // import the non-zero context
}